

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void closeCursorsInFrame(Vdbe *p)

{
  int i;
  long lVar1;
  
  if (p->apCsr != (VdbeCursor **)0x0) {
    for (lVar1 = 0; lVar1 < p->nCursor; lVar1 = lVar1 + 1) {
      if (p->apCsr[lVar1] != (VdbeCursor *)0x0) {
        sqlite3VdbeFreeCursor(p,p->apCsr[lVar1]);
        p->apCsr[lVar1] = (VdbeCursor *)0x0;
      }
    }
  }
  return;
}

Assistant:

static void closeCursorsInFrame(Vdbe *p){
  if( p->apCsr ){
    int i;
    for(i=0; i<p->nCursor; i++){
      VdbeCursor *pC = p->apCsr[i];
      if( pC ){
        sqlite3VdbeFreeCursor(p, pC);
        p->apCsr[i] = 0;
      }
    }
  }
}